

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModel.cpp
# Opt level: O3

bool __thiscall HighsModel::operator==(HighsModel *this,HighsModel *model)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = HighsLp::equalButForNames(&this->lp_,&model->lp_);
  bVar2 = HighsHessian::operator==(&this->hessian_,&model->hessian_);
  bVar3 = HighsLp::equalNames(&this->lp_,&model->lp_);
  return (bVar3 && bVar1) && bVar2;
}

Assistant:

bool HighsModel::operator==(const HighsModel& model) const {
  bool equal = equalButForNames(model);
  equal = this->lp_.equalNames(model.lp_) && equal;
  return equal;
}